

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O3

void __thiscall
chrono::ChShaft::IntStateScatter
          (ChShaft *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,bool full_update)

{
  double *pdVar1;
  undefined8 in_RAX;
  
  if ((long)(ulong)off_x <
      (x->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar1 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    this->pos = pdVar1[off_x];
    if ((long)(ulong)off_v <
        (v->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      this->pos_dt = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [off_v];
      (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
                (this,(ulong)full_update,pdVar1,in_RAX);
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChShaft::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                              const ChState& x,          // state vector, position part
                              const unsigned int off_v,  // offset in v state vector
                              const ChStateDelta& v,     // state vector, speed part
                              const double T,            // time
                              bool full_update           // perform complete update
) {
    SetPos(x(off_x));
    SetPos_dt(v(off_v));
    Update(T, full_update);
}